

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_channel
ma_channel_map_get_channel(ma_channel *pChannelMap,ma_uint32 channelCount,ma_uint32 channelIndex)

{
  uint in_EDX;
  ma_uint32 in_ESI;
  long in_RDI;
  undefined1 local_1;
  
  if (in_RDI == 0) {
    local_1 = ma_channel_map_init_standard_channel(ma_standard_channel_map_default,in_ESI,in_EDX);
  }
  else if (in_EDX < in_ESI) {
    local_1 = *(ma_channel *)(in_RDI + (ulong)in_EDX);
  }
  else {
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

MA_API ma_channel ma_channel_map_get_channel(const ma_channel* pChannelMap, ma_uint32 channelCount, ma_uint32 channelIndex)
{
    if (pChannelMap == NULL) {
        return ma_channel_map_init_standard_channel(ma_standard_channel_map_default, channelCount, channelIndex);
    } else {
        if (channelIndex >= channelCount) {
            return MA_CHANNEL_NONE;
        }

        return pChannelMap[channelIndex];
    }
}